

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterate.cc
# Opt level: O2

void __thiscall ipx::Iterate::ComputeObjectives(Iterate *this)

{
  int iVar1;
  int iVar2;
  StateDetail SVar3;
  Model *pMVar4;
  double *pdVar5;
  double *pdVar6;
  pointer pSVar7;
  double *pdVar8;
  ulong uVar9;
  uint uVar10;
  ulong uVar11;
  Int j;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  
  pMVar4 = this->model_;
  iVar1 = pMVar4->num_rows_;
  iVar2 = pMVar4->num_cols_;
  if (this->postprocessed_ == true) {
    this->offset_ = 0.0;
    dVar14 = pMVar4->offset_;
    dVar12 = Dot(&pMVar4->c_,&this->x_);
    this->pobjective_ = dVar12 + dVar14;
    dVar14 = this->model_->offset_;
    dVar12 = Dot(&pMVar4->b_,&this->y_);
    dVar12 = dVar12 + dVar14;
    this->dobjective_ = dVar12;
    uVar10 = iVar2 + iVar1;
    pdVar5 = (this->zl_)._M_data;
    pdVar6 = (this->zu_)._M_data;
    uVar9 = 0;
    uVar11 = (ulong)uVar10;
    if ((int)uVar10 < 1) {
      uVar11 = uVar9;
    }
    for (; uVar11 != uVar9; uVar9 = uVar9 + 1) {
      dVar14 = (pMVar4->lb_)._M_data[uVar9];
      if ((ulong)ABS(dVar14) < 0x7ff0000000000000) {
        dVar12 = dVar12 + dVar14 * pdVar5[uVar9];
        this->dobjective_ = dVar12;
      }
      dVar14 = (pMVar4->ub_)._M_data[uVar9];
      if ((ulong)ABS(dVar14) < 0x7ff0000000000000) {
        dVar12 = dVar12 - dVar14 * pdVar6[uVar9];
        this->dobjective_ = dVar12;
      }
    }
  }
  else {
    this->offset_ = 0.0;
    dVar14 = pMVar4->offset_;
    this->pobjective_ = dVar14;
    uVar10 = iVar2 + iVar1;
    pSVar7 = (this->variable_state_).
             super__Vector_base<ipx::Iterate::StateDetail,_std::allocator<ipx::Iterate::StateDetail>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pdVar5 = (this->x_)._M_data;
    pdVar6 = (this->zl_)._M_data;
    pdVar8 = (this->zu_)._M_data;
    uVar9 = 0;
    uVar11 = (ulong)uVar10;
    if ((int)uVar10 < 1) {
      uVar11 = uVar9;
    }
    dVar13 = 0.0;
    dVar12 = dVar14;
    for (; uVar11 != uVar9; uVar9 = uVar9 + 1) {
      SVar3 = pSVar7[uVar9];
      dVar15 = pdVar5[uVar9] * (pMVar4->c_)._M_data[uVar9];
      if (SVar3 == FIXED) {
LAB_0037fb38:
        dVar13 = dVar13 + dVar15;
        this->offset_ = dVar13;
      }
      else {
        dVar12 = dVar15 + dVar12;
        this->pobjective_ = dVar12;
        if (SVar3 - IMPLIED_LB < 3) {
          dVar12 = dVar12 - (pdVar6[uVar9] - pdVar8[uVar9]) * pdVar5[uVar9];
          this->pobjective_ = dVar12;
          dVar15 = (pdVar6[uVar9] - pdVar8[uVar9]) * pdVar5[uVar9];
          goto LAB_0037fb38;
        }
      }
    }
    dVar12 = Dot(&pMVar4->b_,&this->y_);
    dVar14 = dVar14 + dVar12;
    this->dobjective_ = dVar14;
    for (uVar9 = 0; uVar11 != uVar9; uVar9 = uVar9 + 1) {
      SVar3 = (this->variable_state_).
              super__Vector_base<ipx::Iterate::StateDetail,_std::allocator<ipx::Iterate::StateDetail>_>
              ._M_impl.super__Vector_impl_data._M_start[uVar9];
      if ((SVar3 & ~BARRIER_BOXED) == BARRIER_LB) {
        dVar14 = dVar14 + (pMVar4->lb_)._M_data[uVar9] * (this->zl_)._M_data[uVar9];
        this->dobjective_ = dVar14;
      }
      if (SVar3 - BARRIER_UB < 2) {
        dVar13 = (pMVar4->ub_)._M_data[uVar9] * (this->zu_)._M_data[uVar9];
LAB_0037fbfc:
        dVar14 = dVar14 - dVar13;
        this->dobjective_ = dVar14;
      }
      else if (SVar3 == FIXED) {
        dVar12 = (this->x_)._M_data[uVar9];
        dVar13 = DotColumn(&pMVar4->AI_,(Int)uVar9,&this->y_);
        dVar14 = this->dobjective_;
        dVar13 = dVar13 * dVar12;
        goto LAB_0037fbfc;
      }
    }
  }
  return;
}

Assistant:

void Iterate::ComputeObjectives() const {
    const Int m = model_.rows();
    const Int n = model_.cols();
    const Vector& b = model_.b();
    const Vector& c = model_.c();
    const Vector& lb = model_.lb();
    const Vector& ub = model_.ub();
    const SparseMatrix& AI = model_.AI();

    if (postprocessed_) {
        // Compute objective values as defined for the LP model.
        offset_ = 0.0;
        pobjective_ = model_.offset() + Dot(c, x_);
        dobjective_ = model_.offset() + Dot(b, y_);
        for (Int j = 0; j < n+m; j++) {
            if (std::isfinite(lb[j]))
                dobjective_ += lb[j] * zl_[j];
            if (std::isfinite(ub[j]))
                dobjective_ -= ub[j] * zu_[j];
        }
    } else {
        // Compute objective values for the LP that is solved at the very moment
        // (after fixing and implying variables). The offset is such that
        // pobjective_ + offset_ is the primal objective after postprocessing.
        offset_ = 0.0;
        pobjective_ = model_.offset();
        for (Int j = 0; j < n+m; j++) {
            if (StateOf(j) != State::fixed)
                pobjective_ += c[j] * x_[j];
            else
                offset_ += c[j] * x_[j];
            if (is_implied(j)) {
                // At the moment, we are solving an LP with the cost coefficient
                // for variable j decreased by zl[j]-zu[j].
                pobjective_ -= (zl_[j]-zu_[j]) * x_[j];
                offset_ += (zl_[j]-zu_[j]) * x_[j];
            }
        }
        dobjective_ = model_.offset() + Dot(b, y_);
        for (Int j = 0; j < n+m; j++) {
            if (has_barrier_lb(j))
                dobjective_ += lb[j] * zl_[j];
            if (has_barrier_ub(j))
                dobjective_ -= ub[j] * zu_[j];
            if (StateOf(j) == State::fixed)
                // At the moment, we are solving the LP without variable j,
                // but with the RHS decreased by AI[:,j]*x[j].
                dobjective_ -= x_[j] * DotColumn(AI, j, y_);
        }
    }
}